

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oasis.h
# Opt level: O0

void initstreams(string *inFile,string *outFile)

{
  FILE *pFVar1;
  long lVar2;
  char *pcVar3;
  FILE *pFVar4;
  undefined8 uVar5;
  string *outFile_local;
  string *inFile_local;
  
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pFVar4 = freopen(pcVar3,"wb",_stdout);
    pFVar1 = _stderr;
    if (pFVar4 == (FILE *)0x0) {
      uVar5 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"%s: Error opening file %s\n","initstreams",uVar5);
      exit(-1);
    }
  }
  lVar2 = std::__cxx11::string::length();
  if (lVar2 != 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    pFVar4 = freopen(pcVar3,"rb",_stdin);
    pFVar1 = _stderr;
    if (pFVar4 == (FILE *)0x0) {
      uVar5 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"%s: Error opening file %s\n","initstreams",uVar5);
      exit(-1);
    }
  }
  freopen((char *)0x0,"a+b",_stdout);
  freopen((char *)0x0,"rb",_stdin);
  return;
}

Assistant:

inline void initstreams(std::string inFile="", std::string outFile="")
{

   if (outFile.length() > 0){
       if (freopen(outFile.c_str(), "wb", stdout) == NULL) {
		   fprintf(stderr, "%s: Error opening file %s\n", __func__, outFile.c_str());
           exit(-1);
        }
   }

   if (inFile.length() > 0){
        if (freopen(inFile.c_str(), "rb", stdin) == NULL) {
			fprintf(stderr, "%s: Error opening file %s\n", __func__, inFile.c_str());
            exit(-1);
         }
   }

#if defined(_MSC_VER) || defined(__MINGW32__)
	_setmode(_fileno(stdout), O_BINARY);
	_setmode(_fileno(stdin), O_BINARY);
#elif __APPLE__
	freopen(NULL, "wb", stdout);
	freopen(NULL, "rb", stdin);
#elif __linux
	freopen(NULL, "a+b", stdout);
	freopen(NULL, "rb", stdin);
#endif

}